

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_TestShell::
createTest(TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_TestShell
           *this)

{
  TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_Test
  *this_00;
  TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_TestShell
  *this_local;
  
  this_00 = (TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_Test
             *)operator_new(0xa0,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringCacheTest.cpp"
                            ,0xb8);
  TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_Test::
  TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SimpleStringInternalCache, clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory)
{
    cache.setAllocator(allocator);

    char* mem = cache.alloc(10);
    cache.dealloc(mem, 10);

    cache.alloc(60);

    cache.clearCache();

    LONGS_EQUAL(1, accountant.totalDeallocationsOfSize(32));
    LONGS_EQUAL(0, accountant.totalDeallocationsOfSize(64));
}